

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwShLo(word *a,size_t n,size_t shift)

{
  ulong uVar1;
  sbyte sVar2;
  ulong in_RDX;
  ulong in_RSI;
  word *in_RDI;
  size_t pos;
  size_t wshift;
  ulong local_28;
  
  if (in_RDX < in_RSI << 6) {
    uVar1 = in_RDX >> 6;
    if ((in_RDX & 0x3f) == 0) {
      for (local_28 = 0; local_28 + uVar1 < in_RSI; local_28 = local_28 + 1) {
        in_RDI[local_28] = in_RDI[local_28 + uVar1];
      }
    }
    else {
      for (local_28 = 0; sVar2 = (sbyte)(in_RDX & 0x3f), local_28 + uVar1 + 1 < in_RSI;
          local_28 = local_28 + 1) {
        in_RDI[local_28] =
             in_RDI[local_28 + uVar1] >> sVar2 |
             in_RDI[local_28 + uVar1 + 1] << (0x40U - sVar2 & 0x3f);
      }
      in_RDI[local_28] = in_RDI[local_28 + uVar1] >> sVar2;
      local_28 = local_28 + 1;
    }
    while (local_28 < in_RSI) {
      in_RDI[local_28] = 0;
      local_28 = local_28 + 1;
    }
  }
  else {
    wwSetZero(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void wwShLo(word a[], size_t n, size_t shift)
{
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * n)
	{
		size_t wshift = shift / B_PER_W, pos;
		// величина сдвига не кратна длине слова?
		if (shift %= B_PER_W)
		{
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// последнее слово
			ASSERT(pos + wshift < n);
			a[pos] = a[pos + wshift] >> shift;
			++pos;
		}
		// величина сдвига кратна длине слова
		else for (pos = 0; pos + wshift < n; pos++)
			a[pos] = a[pos + wshift];
		// обнуление последних слов
		for (; pos < n; a[pos++] = 0);
	}
	else
		wwSetZero(a, n);
}